

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>::
emplace_helper<QStyleSheetStyleCaches::Tampered<QFont>const&>
          (QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>> *this,QWidget **key,
          Tampered<QFont> *args)

{
  piter pVar1;
  Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_> *n;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>>::
  findOrInsert<QWidget_const*>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>> **)
              this,key);
  n = (Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_> *)
      ((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries +
      (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
      [(uint)local_38._8_8_ & 0x7f]);
  if (local_38[0x10] == false) {
    QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>::
    createInPlace<QStyleSheetStyleCaches::Tampered<QFont>const&>(n,key,args);
  }
  else {
    QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>::
    emplaceValue<QStyleSheetStyleCaches::Tampered<QFont>const&>
              ((Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>> *)n,args);
  }
  pVar1.bucket = local_38._8_8_;
  pVar1.d = (Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_> *)
            local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }